

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_felippa_rule.cpp
# Opt level: O0

void subcomp_next(int n,int k,int *a,bool *more,int *h,int *t)

{
  int local_34;
  int i;
  int *t_local;
  int *h_local;
  bool *more_local;
  int *a_local;
  int k_local;
  int n_local;
  
  if ((*more & 1U) == 0) {
    subcomp_next::n2 = 0;
    for (local_34 = 0; local_34 < k; local_34 = local_34 + 1) {
      a[local_34] = 0;
    }
    subcomp_next::more2 = false;
    *h = 0;
    *t = 0;
    *more = true;
  }
  else if (subcomp_next::more2) {
    comp_next(subcomp_next::n2,k,a,&subcomp_next::more2,h,t);
  }
  else {
    subcomp_next::more2 = false;
    subcomp_next::n2 = subcomp_next::n2 + 1;
    comp_next(subcomp_next::n2,k,a,&subcomp_next::more2,h,t);
  }
  if (((subcomp_next::more2 & 1U) == 0) && (subcomp_next::n2 == n)) {
    *more = false;
  }
  return;
}

Assistant:

void subcomp_next ( int n, int k, int a[], bool *more, int *h, int *t )

//****************************************************************************80
//
//  Purpose:
//
//    SUBCOMP_NEXT computes the next subcomposition of N into K parts.
//
//  Discussion:
//
//    A composition of the integer N into K parts is an ordered sequence
//    of K nonnegative integers which sum to a value of N.
//
//    A subcomposition of the integer N into K parts is a composition
//    of M into K parts, where 0 <= M <= N.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    02 July 2008
//
//  Author:
//
//    Original FORTRAN77 version by Albert Nijenhuis, Herbert Wilf.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Albert Nijenhuis, Herbert Wilf,
//    Combinatorial Algorithms for Computers and Calculators,
//    Second Edition,
//    Academic Press, 1978,
//    ISBN: 0-12-519260-6,
//    LC: QA164.N54.
//
//  Parameters:
//
//    Input, int N, the integer whose subcompositions are desired.
//
//    Input, int K, the number of parts in the subcomposition.
//
//    Input/output, int A[K], the parts of the subcomposition.
//
//    Input/output, bool *MORE, set by the user to start the computation,
//    and by the routine to terminate it.
//
//    Input/output, int *H, *T, two internal parameters needed for the
//    computation.  The user should allocate space for these in the calling
//    program, include them in the calling sequence, but never alter them!
//
{
  int i;
  static bool more2 = false;
  static int n2 = 0;
//
//  The first computation.
//
  if ( !( *more ) )
  {
    n2 = 0;

    for ( i = 0; i < k; i++ )
    {
      a[i] = 0;
    }
    more2 = false;
    *h = 0;
    *t = 0;

    *more = true;
  }
//
//  Do the next element at the current value of N.
//
  else if ( more2 )
  {
    comp_next ( n2, k, a, &more2, h, t );
  }
  else
  {
    more2 = false;
    n2 = n2 + 1;

    comp_next ( n2, k, a, &more2, h, t );
  }
//
//  Termination occurs if MORE2 = FALSE and N2 = N.
//
  if ( !more2 && n2 == n )
  {
    *more = false;
  }

  return;
}